

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_transport.c
# Opt level: O1

int tr_tcp_recv(void *tr_tcp_sock,void *pdu,size_t len,time_t timeout)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  char *pcVar6;
  tr_tcp_socket *tmp;
  long in_FS_OFFSET;
  timeval t;
  time_t local_38 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (timeout == 0) {
    sVar4 = recv(*tr_tcp_sock,pdu,len,0x40);
    iVar3 = (int)sVar4;
LAB_00107e35:
    if (iVar3 == 0) {
      iVar3 = -4;
      goto LAB_00107e8d;
    }
    if (iVar3 != -1) goto LAB_00107e8d;
    piVar5 = __errno_location();
    iVar3 = *piVar5;
    if (iVar3 == 0xb) {
      iVar3 = -2;
      goto LAB_00107e8d;
    }
    if (iVar3 == 4) {
      iVar3 = -3;
      goto LAB_00107e8d;
    }
    uVar1 = *(undefined8 *)((long)tr_tcp_sock + 8);
    uVar2 = *(undefined8 *)((long)tr_tcp_sock + 0x10);
    pcVar6 = strerror(iVar3);
    lrtr_dbg("TCP Transport(%s:%s): recv(..) error: %s",uVar1,uVar2,pcVar6);
  }
  else {
    local_38[1] = 0;
    local_38[0] = timeout;
    iVar3 = setsockopt(*tr_tcp_sock,1,0x14,local_38,0x10);
    if (iVar3 != -1) {
      sVar4 = recv(*tr_tcp_sock,pdu,len,0);
      iVar3 = (int)sVar4;
      goto LAB_00107e35;
    }
    uVar1 = *(undefined8 *)((long)tr_tcp_sock + 8);
    uVar2 = *(undefined8 *)((long)tr_tcp_sock + 0x10);
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    lrtr_dbg("TCP Transport(%s:%s): setting SO_RCVTIMEO failed, %s",uVar1,uVar2,pcVar6);
  }
  iVar3 = -1;
LAB_00107e8d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int tr_tcp_recv(const void *tr_tcp_sock, void *pdu, const size_t len, const time_t timeout)
{
	const struct tr_tcp_socket *tcp_socket = tr_tcp_sock;
	int rtval;

	if (timeout == 0) {
		rtval = recv(tcp_socket->socket, pdu, len, MSG_DONTWAIT);
	} else {
		struct timeval t = {timeout, 0};

		if (setsockopt(tcp_socket->socket, SOL_SOCKET, SO_RCVTIMEO, &t, sizeof(t)) == -1) {
			TCP_DBG("setting SO_RCVTIMEO failed, %s", tcp_socket, strerror(errno));
			return TR_ERROR;
		}
		rtval = recv(tcp_socket->socket, pdu, len, 0);
	}

	if (rtval == -1) {
		if (errno == EAGAIN || errno == EWOULDBLOCK)
			return TR_WOULDBLOCK;
		if (errno == EINTR)
			return TR_INTR;
		TCP_DBG("recv(..) error: %s", tcp_socket, strerror(errno));
		return TR_ERROR;
	}
	if (rtval == 0)
		return TR_CLOSED;
	return rtval;
}